

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O2

void __thiscall
string_view_operator_less_than_Test::TestBody(string_view_operator_less_than_Test *this)

{
  bool bVar1;
  int line;
  char *in_R9;
  string_view x;
  string_view x_00;
  string_view x_01;
  string_view y;
  string_view y_00;
  string_view y_01;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertionResult gtest_ar_;
  string local_40;
  
  x.size_ = 3;
  x.data_ = "abc";
  y.size_ = 3;
  y.data_ = "xyz";
  gtest_ar_.success_ = wabt::operator<(x,y);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    x_00.size_ = 5;
    x_00.data_ = "later";
    y_00.size_ = 7;
    y_00.data_ = "earlier";
    bVar1 = wabt::operator<(x_00,y_00);
    gtest_ar_.success_ = !bVar1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar_.success_) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      x_01.size_ = 3;
      x_01.data_ = "one";
      y_01.size_ = 3;
      y_01.data_ = "one";
      bVar1 = wabt::operator<(x_01,y_01);
      gtest_ar_.success_ = !bVar1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (gtest_ar_.success_) goto LAB_00205eb5;
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,(internal *)&gtest_ar_,
                 (AssertionResult *)"string_view(\"one\") < string_view(\"one\")","true","false",
                 in_R9);
      line = 0x185;
    }
    else {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,(internal *)&gtest_ar_,
                 (AssertionResult *)"string_view(\"later\") < string_view(\"earlier\")","true",
                 "false",in_R9);
      line = 0x184;
    }
  }
  else {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"string_view(\"abc\") < string_view(\"xyz\")","false","true",in_R9
              );
    line = 0x183;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
             ,line,local_40._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  std::__cxx11::string::_M_dispose();
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_58);
LAB_00205eb5:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(string_view, operator_less_than) {
  ASSERT_TRUE(string_view("abc") < string_view("xyz"));
  ASSERT_FALSE(string_view("later") < string_view("earlier"));
  ASSERT_FALSE(string_view("one") < string_view("one"));
}